

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

pair<slang::syntax::PragmaExpressionSyntax_*,_bool> __thiscall
slang::parsing::Preprocessor::parsePragmaExpression(Preprocessor *this)

{
  bool bVar1;
  bool bVar2;
  type_conflict2 *__y;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  Preprocessor *in_RDI;
  Token TVar3;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar4;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar5;
  NameValuePragmaExpressionSyntax *result;
  type_conflict2 *succeeded;
  type *expr;
  Token equals;
  Token name;
  Token token;
  Preprocessor *in_stack_00000300;
  Preprocessor *in_stack_ffffffffffffff38;
  Preprocessor *in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff59;
  undefined7 in_stack_ffffffffffffff60;
  bool in_stack_ffffffffffffff67;
  SimplePragmaExpressionSyntax *in_stack_ffffffffffffff68;
  NameValuePragmaExpressionSyntax *in_stack_ffffffffffffff70;
  TokenKind local_48;
  TokenKind local_28;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> local_10;
  
  TVar3 = peek(in_RDI);
  local_28 = TVar3.kind;
  if ((local_28 == Identifier) || (bVar1 = LexerFacts::isKeyword(local_28), bVar1)) {
    consume(in_stack_ffffffffffffff50);
    bVar2 = peekSameLine(in_stack_ffffffffffffff38);
    bVar1 = false;
    if (bVar2) {
      TVar3 = peek(in_RDI);
      local_48 = TVar3.kind;
      bVar1 = local_48 == Equals;
    }
    if (bVar1) {
      consume(in_stack_ffffffffffffff50);
      parsePragmaValue(in_stack_00000300);
      std::get<0ul,slang::syntax::PragmaExpressionSyntax*,bool>
                ((pair<slang::syntax::PragmaExpressionSyntax_*,_bool> *)0x299b3f);
      __y = std::get<1ul,slang::syntax::PragmaExpressionSyntax*,bool>
                      ((pair<slang::syntax::PragmaExpressionSyntax_*,_bool> *)0x299b4e);
      BumpAllocator::
      emplace<slang::syntax::NameValuePragmaExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PragmaExpressionSyntax&>
                ((BumpAllocator *)in_stack_ffffffffffffff70,(Token *)in_stack_ffffffffffffff68,
                 (Token *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (PragmaExpressionSyntax *)
                 CONCAT71(in_stack_ffffffffffffff59,in_stack_ffffffffffffff58));
      std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::
      pair<slang::syntax::NameValuePragmaExpressionSyntax_*&,_bool_&,_true>
                (&local_10,(NameValuePragmaExpressionSyntax **)&stack0xffffffffffffff70,__y);
      pVar4._8_8_ = extraout_RDX;
      pVar4.first = local_10.first;
    }
    else {
      BumpAllocator::emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                ((BumpAllocator *)in_stack_ffffffffffffff50,(Token *)in_RDI);
      std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::
      pair<slang::syntax::SimplePragmaExpressionSyntax_*,_bool,_true>
                (&local_10,(SimplePragmaExpressionSyntax **)&stack0xffffffffffffff68,
                 (bool *)&stack0xffffffffffffff67);
      pVar4._8_8_ = extraout_RDX_00;
      pVar4.first = local_10.first;
    }
  }
  else {
    pVar4 = parsePragmaValue(in_stack_00000300);
    local_10.second = pVar4.second;
  }
  local_10.first = pVar4.first;
  pVar5._9_7_ = pVar4._9_7_;
  pVar5.second = local_10.second;
  pVar5.first = local_10.first;
  return pVar5;
}

Assistant:

std::pair<PragmaExpressionSyntax*, bool> Preprocessor::parsePragmaExpression() {
    Token token = peek();
    if (token.kind == TokenKind::Identifier || LexerFacts::isKeyword(token.kind)) {
        auto name = consume();
        if (peekSameLine() && peek().kind == TokenKind::Equals) {
            auto equals = consume();
            auto [expr, succeeded] = parsePragmaValue();
            auto result = alloc.emplace<NameValuePragmaExpressionSyntax>(name, equals, *expr);
            return {result, succeeded};
        }

        return {alloc.emplace<SimplePragmaExpressionSyntax>(name), true};
    }

    return parsePragmaValue();
}